

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DefaultNullOrderSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  bool bVar1;
  ParserException *this;
  DefaultOrderByNullType DVar2;
  allocator local_79;
  string parameter;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Value::ToString_abi_cxx11_(&local_58,input);
  StringUtil::Lower((string *)&parameter,(string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  bVar1 = ::std::operator==(&parameter,"nulls_first");
  DVar2 = NULLS_FIRST;
  if (!bVar1) {
    bVar1 = ::std::operator==(&parameter,"nulls first");
    if (!bVar1) {
      bVar1 = ::std::operator==(&parameter,"null first");
      if (!bVar1) {
        bVar1 = ::std::operator==(&parameter,"first");
        if (!bVar1) {
          bVar1 = ::std::operator==(&parameter,"nulls_last");
          DVar2 = NULLS_LAST;
          if (!bVar1) {
            bVar1 = ::std::operator==(&parameter,"nulls last");
            if (!bVar1) {
              bVar1 = ::std::operator==(&parameter,"null last");
              if (!bVar1) {
                bVar1 = ::std::operator==(&parameter,"last");
                if (!bVar1) {
                  bVar1 = ::std::operator==(&parameter,"nulls_first_on_asc_last_on_desc");
                  DVar2 = NULLS_FIRST_ON_ASC_LAST_ON_DESC;
                  if (!bVar1) {
                    bVar1 = ::std::operator==(&parameter,"sqlite");
                    if (!bVar1) {
                      bVar1 = ::std::operator==(&parameter,"mysql");
                      if (!bVar1) {
                        bVar1 = ::std::operator==(&parameter,"nulls_last_on_asc_first_on_desc");
                        DVar2 = NULLS_LAST_ON_ASC_FIRST_ON_DESC;
                        if (!bVar1) {
                          bVar1 = ::std::operator==(&parameter,"postgres");
                          if (!bVar1) {
                            this = (ParserException *)__cxa_allocate_exception(0x10);
                            ::std::__cxx11::string::string
                                      ((string *)&local_58,
                                       "Unrecognized parameter for option NULL_ORDER \"%s\", expected either NULLS FIRST, NULLS LAST, SQLite, MySQL or Postgres"
                                       ,&local_79);
                            ::std::__cxx11::string::string((string *)&local_38,(string *)&parameter)
                            ;
                            ParserException::ParserException<std::__cxx11::string>
                                      (this,&local_58,&local_38);
                            __cxa_throw(this,&ParserException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (config->options).default_null_order = DVar2;
  ::std::__cxx11::string::~string((string *)&parameter);
  return;
}

Assistant:

void DefaultNullOrderSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());

	if (parameter == "nulls_first" || parameter == "nulls first" || parameter == "null first" || parameter == "first") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_FIRST;
	} else if (parameter == "nulls_last" || parameter == "nulls last" || parameter == "null last" ||
	           parameter == "last") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_LAST;
	} else if (parameter == "nulls_first_on_asc_last_on_desc" || parameter == "sqlite" || parameter == "mysql") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_FIRST_ON_ASC_LAST_ON_DESC;
	} else if (parameter == "nulls_last_on_asc_first_on_desc" || parameter == "postgres") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_LAST_ON_ASC_FIRST_ON_DESC;
	} else {
		throw ParserException("Unrecognized parameter for option NULL_ORDER \"%s\", expected either NULLS FIRST, NULLS "
		                      "LAST, SQLite, MySQL or Postgres",
		                      parameter);
	}
}